

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>::
Flush<duckdb::BitpackingCompressionState<duckdb::uhugeint_t,true,duckdb::hugeint_t>::BitpackingWriter>
          (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t> *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  bool bVar3;
  BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t> BVar4;
  byte bVar5;
  byte bVar6;
  unsigned_long uVar7;
  bool bVar8;
  ulong uVar9;
  uhugeint_t *this_00;
  uhugeint_t uVar10;
  void *in_stack_ffffffffffffff90;
  uhugeint_t local_48;
  
  bVar8 = true;
  if (*(long *)(this + 0x10818) == 0) {
    return true;
  }
  if (((this[0x108a1] != (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>)0x0) ||
      (bVar3 = uhugeint_t::operator==((uhugeint_t *)(this + 0x10840),(uhugeint_t *)(this + 0x10830))
      , bVar3)) && ((byte)((char)this[0x108a4] - 1U) < 2)) {
    BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
    WriteConstant(*(uhugeint_t *)(this + 0x10840),*(idx_t *)(this + 0x10818),
                  *(void **)(this + 0x10828),(bool)this[0x108a1]);
    *(long *)(this + 0x10820) = *(long *)(this + 0x10820) + 0x14;
    return true;
  }
  BVar4 = (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>)
          TrySubtractOperator::Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                    (*(uhugeint_t *)(this + 0x10840),*(uhugeint_t *)(this + 0x10830),
                     (uhugeint_t *)(this + 0x10850));
  this[0x108a3] = BVar4;
  BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::CalculateDeltaStats
            ((BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *)this);
  if (this[0x108a2] == (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>)0x1) {
    bVar3 = hugeint_t::operator==((hugeint_t *)(this + 0x10870),(hugeint_t *)(this + 0x10860));
    if ((bVar3) && (((byte)this[0x108a4] & 0xfe) != 4)) {
      BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
      WriteConstantDelta(*(hugeint_t *)(this + 0x10870),**(uhugeint_t **)(this + 0x8010),
                         *(idx_t *)(this + 0x10818),*(uhugeint_t **)(this + 0x8010),
                         (bool *)(this + 0x10018),*(void **)(this + 0x10828));
      *(long *)(this + 0x10820) = *(long *)(this + 0x10820) + 0x24;
      return true;
    }
    uVar10 = hugeint_t::operator_cast_to_uhugeint_t((hugeint_t *)(this + 0x10880));
    bVar5 = BitpackingPrimitives::FindMinimumBitWidth<duckdb::uhugeint_t,false,false>(uVar10,uVar10)
    ;
    bVar6 = BitpackingPrimitives::FindMinimumBitWidth<duckdb::uhugeint_t,false,false>
                      (*(uhugeint_t *)(this + 0x10850),*(uhugeint_t *)(this + 0x10850));
    BVar4 = this[0x108a4];
    if (BVar4 != (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>)0x5 && bVar5 < bVar6) {
      BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::
      SubtractFrameOfReference<duckdb::hugeint_t>
                ((BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *)this,
                 (hugeint_t *)(this + 0x8018),*(hugeint_t *)(this + 0x10860));
      uVar10 = hugeint_t::operator_cast_to_uhugeint_t((hugeint_t *)(this + 0x10860));
      in_stack_ffffffffffffff90 = *(void **)(this + 0x10898);
      BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
      WriteDeltaFor((uhugeint_t *)(this + 0x8018),(bool *)(this + 0x10018),bVar5,uVar10,
                    *(hugeint_t *)(this + 0x10890),*(uhugeint_t **)(this + 0x8010),
                    *(idx_t *)(this + 0x10818),*(void **)(this + 0x10828));
      *(long *)(this + 0x10820) = *(long *)(this + 0x10820) + 0x28;
      uVar9 = *(ulong *)(this + 0x10818);
      if ((uVar9 & 0x1f) != 0) {
        uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar9 & 0x1f);
        uVar9 = (uVar9 - uVar7) + 0x20;
      }
      *(ulong *)(this + 0x10820) = *(long *)(this + 0x10820) + (bVar5 * uVar9 >> 3);
      if (BVar4 != (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>)0x5 && bVar5 < bVar6) {
        return true;
      }
    }
  }
  if (this[0x108a3] == (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>)0x1) {
    bVar5 = BitpackingPrimitives::FindMinimumBitWidth<duckdb::uhugeint_t,false,false>
                      (*(uhugeint_t *)(this + 0x10850),*(uhugeint_t *)(this + 0x10850));
    if (*(long *)(this + 0x10818) != 0) {
      this_00 = *(uhugeint_t **)(this + 0x8010);
      uVar1 = *(uint64_t *)(this + 0x10830);
      uVar2 = *(uint64_t *)(this + 0x10838);
      uVar9 = 0;
      do {
        local_48.lower = uVar1;
        local_48.upper = uVar2;
        uhugeint_t::operator-=(this_00,&local_48);
        uVar9 = uVar9 + 1;
        this_00 = this_00 + 1;
      } while (uVar9 < *(ulong *)(this + 0x10818));
    }
    uVar10.upper = *(uint64_t *)(this + 0x10818);
    uVar10.lower = *(uint64_t *)(this + 0x10838);
    BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
    WriteFor(*(BitpackingWriter **)(this + 0x8010),(uhugeint_t *)(this + 0x10018),
             (bool *)(ulong)bVar5,(bitpacking_width_t)*(undefined8 *)(this + 0x10830),uVar10,
             *(idx_t *)(this + 0x10828),in_stack_ffffffffffffff90);
    uVar9 = *(ulong *)(this + 0x10818);
    if ((uVar9 & 0x1f) != 0) {
      uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar9 & 0x1f);
      uVar9 = (uVar9 - uVar7) + 0x20;
    }
    *(ulong *)(this + 0x10820) =
         *(long *)(this + 0x10820) + ((long)(ulong)bVar5 * uVar9 >> 3) + 0x18;
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}